

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O3

void Npn_ManRead(Npn_Man_t *p,char *pFileName)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  Npn_Obj_t *pNVar4;
  uint Truth [2];
  char pBuffer [1000];
  word local_420;
  char local_418 [1000];
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open NPN function file \"%s\".\n",pFileName);
    return;
  }
  pcVar2 = fgets(local_418,1000,__stream);
  if (pcVar2 != (char *)0x0) {
    do {
      pcVar2 = strtok(local_418," \t\n");
      if ((pcVar2 != (char *)0x0) && (*pcVar2 != '#')) {
        sVar3 = strlen(pcVar2);
        if (sVar3 == 0x10) {
          Extra_ReadHexadecimal((uint *)&local_420,pcVar2,6);
          pNVar4 = Npn_ManAdd(p,local_420);
          if (pNVar4->Count != 1) {
            __assert_fail("pEntry->Count == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNpnSave.c"
                          ,0x201,"void Npn_ManRead(Npn_Man_t *, char *)");
          }
          pcVar2 = strtok((char *)0x0," \t\n");
          iVar1 = atoi(pcVar2);
          pNVar4->Count = iVar1;
        }
        else {
          Abc_Print(0,"Skipping token %s that does not look like a 16-digit hex number.\n");
        }
      }
      pcVar2 = fgets(local_418,1000,__stream);
    } while (pcVar2 != (char *)0x0);
  }
  fclose(__stream);
  return;
}

Assistant:

void Npn_ManRead( Npn_Man_t * p, char * pFileName )
{
    char pBuffer[1000];
    char * pToken;
    Npn_Obj_t * pEntry;
    unsigned Truth[2];
    word uTruth;
    FILE * pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        Abc_Print( -1, "Cannot open NPN function file \"%s\".\n", pFileName );
        return;
    }
    // read lines from the file
    while ( fgets( pBuffer, 1000, pFile ) != NULL )
    {
        pToken = strtok( pBuffer, " \t\n" );
        if ( pToken == NULL )
            continue;
        if ( pToken[0] == '#' )
            continue;
        if ( strlen(pToken) != 16 )
        {
            Abc_Print( 0, "Skipping token %s that does not look like a 16-digit hex number.\n" );
            continue;
        }
        // extract truth table
        Extra_ReadHexadecimal( Truth, pToken, 6 );
        uTruth = (((word)Truth[1]) << 32) | (word)Truth[0];
        // add truth table
        pEntry = Npn_ManAdd( p, uTruth );
        assert( pEntry->Count == 1 );
        // read area
        pToken = strtok( NULL, " \t\n" );
        pEntry->Count = atoi(pToken);
    }
    fclose( pFile );
}